

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

void AlphaVectorPlanning::ExportBeliefSet(BeliefSet *B,string *filename)

{
  pointer ppJVar1;
  pointer ppJVar2;
  JointBeliefInterface *pJVar3;
  int iVar4;
  ostream *poVar5;
  E *this;
  uint s;
  int iVar6;
  ulong uVar7;
  double dVar8;
  string sStack_3d8;
  stringstream ss;
  ostream local_3a8 [376];
  ofstream fp;
  byte abStack_210 [480];
  
  std::ofstream::ofstream(&fp,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_210[*(long *)(_fp + -0x18)] & 5) == 0) {
    ppJVar1 = (B->
              super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    ppJVar2 = (B->
              super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar7 != ((ulong)((long)ppJVar1 - (long)ppJVar2) >> 3 & 0xffffffff);
        uVar7 = uVar7 + 1) {
      iVar6 = 0;
      while( true ) {
        pJVar3 = (B->
                 super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar7];
        iVar4 = (**(code **)(*(long *)((long)&pJVar3->field_0x0 + *(long *)((long)*pJVar3 + -0xb8))
                            + 0x70))((long)&pJVar3->field_0x0 + *(long *)((long)*pJVar3 + -0xb8));
        if (iVar6 == iVar4) break;
        pJVar3 = (B->
                 super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar7];
        dVar8 = (double)(**(code **)(*(long *)((long)&pJVar3->field_0x0 +
                                              *(long *)((long)*pJVar3 + -0xb8)) + 0x48))
                                  ((long)&pJVar3->field_0x0 + *(long *)((long)*pJVar3 + -0xb8),iVar6
                                  );
        poVar5 = std::ostream::_M_insert<double>(dVar8);
        std::operator<<(poVar5," ");
        iVar6 = iVar6 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&fp);
    }
    std::ofstream::~ofstream(&fp);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar5 = std::operator<<(local_3a8,"AlphaVectorPlanning::ExportBeliefSet: failed to open file ");
  std::operator<<(poVar5,(string *)filename);
  this = (E *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  E::E(this,&sStack_3d8);
  __cxa_throw(this,&E::typeinfo,E::~E);
}

Assistant:

void AlphaVectorPlanning::ExportBeliefSet(const BeliefSet &B,
                                          const string &filename)
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "AlphaVectorPlanning::ExportBeliefSet: failed to open file "
           << filename;
        throw(E(ss.str()));
    }

    int nrB=B.size();
    for(int b=0;b!=nrB;b++)
    {
        for(unsigned int s=0;s!=B[b]->Size();s++)
            fp << B[b]->Get(s) << " ";
        fp << endl;
    }
}